

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testobject.cpp
# Opt level: O0

void test_val(float id,Am_Wrapper *result,Am_Wrapper *expected)

{
  ostream *poVar1;
  void *pvVar2;
  ulong uVar3;
  Am_Wrapper *expected_local;
  Am_Wrapper *result_local;
  float id_local;
  
  test_counter = test_counter + 1;
  if (suppress_successful == 0) {
    poVar1 = (ostream *)std::ostream::operator<<(&std::cout,id);
    std::operator<<(poVar1,"     ");
  }
  else if (test_counter % 0x32 == 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Test ");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,test_counter);
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  }
  uVar3 = (**(code **)(*(long *)result + 0x30))(result,expected);
  if ((uVar3 & 1) == 0) {
    poVar1 = (ostream *)std::ostream::operator<<(&std::cout,id);
    poVar1 = std::operator<<(poVar1,"       expected ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,expected);
    poVar1 = std::operator<<(poVar1," result is ");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,result);
    poVar1 = (ostream *)std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<(poVar1,"*** TEST DID NOT SUCCEED. ***");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    failed_tests = failed_tests + 1;
  }
  else if (suppress_successful == 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"  result is ");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,result);
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  }
  Am_Wrapper::Release(result);
  Am_Wrapper::Release(expected);
  return;
}

Assistant:

void
test_val(float id, Am_Wrapper *result, Am_Wrapper *expected)
{
  ++test_counter;
  if (suppress_successful) {
    if ((test_counter % 50) == 0)
      cout << "Test " << test_counter << endl;
  } else
    cout << id << "     ";

  if (*result == *expected) {
    if (!suppress_successful)
      cout << "  result is " << result << endl;
  } else {
    cout << id << "       expected " << expected << " result is " << result
         << endl
         << "*** TEST DID NOT SUCCEED. ***" << endl;
    ++failed_tests;
  }
  result->Release();
  expected->Release();
}